

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcSIUnit::~IfcSIUnit(IfcSIUnit *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  
  (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcSIUnit_0085e948;
  *(undefined ***)&this->field_0x90 = &PTR__IfcSIUnit_0085e998;
  *(undefined ***)&(this->super_IfcNamedUnit).field_0x38 = &PTR__IfcSIUnit_0085e970;
  pcVar2 = (this->Name)._M_dataplus._M_p;
  paVar1 = &(this->Name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  puVar3 = *(undefined1 **)&(this->super_IfcNamedUnit).field_0x48;
  if (puVar3 != &this->field_0x58) {
    operator_delete(puVar3,*(long *)&this->field_0x58 + 1);
  }
  (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x85e9c0;
  *(undefined8 *)&this->field_0x90 = 0x85e9e8;
  puVar4 = *(undefined1 **)
            &(this->super_IfcNamedUnit).
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.field_0x18;
  puVar3 = &(this->super_IfcNamedUnit).field_0x28;
  if (puVar4 != puVar3) {
    operator_delete(puVar4,*(long *)puVar3 + 1);
  }
  operator_delete(this,0xa8);
  return;
}

Assistant:

IfcSIUnit() : Object("IfcSIUnit") {}